

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O2

CWalletTx * __thiscall
wallet::wallet_tests::ListCoinsTestingSetup::AddTx(ListCoinsTestingSetup *this,CRecipient recipient)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  long lVar1;
  CWallet *pCVar2;
  mapValue_t mapValue;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  orderForm;
  int iVar3;
  T *pTVar4;
  mapped_type *pmVar5;
  Chainstate *pCVar6;
  iterator iVar7;
  CRecipient *in_RSI;
  CCoinControl *coin_control;
  iterator pvVar8;
  iterator pvVar9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  initializer_list<wallet::CRecipient> __l;
  const_string file;
  CTransactionRef tx_00;
  initializer_list<CMutableTransaction> __l_00;
  const_string file_00;
  undefined4 uVar10;
  undefined4 uVar11;
  check_type cVar12;
  undefined8 in_stack_fffffffffffffb08;
  undefined8 in_stack_fffffffffffffb10;
  undefined8 in_stack_fffffffffffffb18;
  size_t in_stack_fffffffffffffb20;
  undefined8 in_stack_fffffffffffffb28;
  undefined8 in_stack_fffffffffffffb30;
  pointer in_stack_fffffffffffffb38;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4b8;
  undefined1 local_498 [56];
  char *local_460;
  CTransactionRef tx;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock50;
  uint256 local_430;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock49;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock48;
  shared_count sStack_3e0;
  pointer pCStack_3d8;
  CBlock local_3b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_348;
  CMutableTransaction blocktx;
  Result<wallet::CreatedTransactionResult> res;
  CCoinControl dummy;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CCoinControl::CCoinControl(&dummy);
  pCVar2 = (this->wallet)._M_t.
           super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
           super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl;
  CRecipient::CRecipient((CRecipient *)&blocktx,in_RSI);
  __l._M_len = 1;
  __l._M_array = (iterator)&blocktx;
  std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::vector
            ((vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)&criticalblock48,__l
             ,(allocator_type *)&criticalblock49);
  coin_control = &dummy;
  pvVar8 = &DAT_00000001;
  CreateTransaction(&res,pCVar2,
                    (vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)
                    &criticalblock48,(optional<unsigned_int>)0x0,coin_control,true);
  std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::~vector
            ((vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)&criticalblock48);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&blocktx);
  local_498._48_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_460 = "";
  local_498._32_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_498._40_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = pvVar8;
  msg.m_begin = (iterator)coin_control;
  file.m_end = (iterator)0x257;
  file.m_begin = local_498 + 0x30;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)(local_498 + 0x20),
             msg);
  criticalblock48.super_unique_lock._M_device._0_1_ =
       res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
       super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
       super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
       super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
       super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
       super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_index ==
       '\x01';
  criticalblock48.super_unique_lock._M_owns = false;
  criticalblock48.super_unique_lock._9_7_ = 0;
  sStack_3e0.pi_ = (sp_counted_base *)0x0;
  criticalblock49.super_unique_lock._M_device = (mutex_type *)0xc7d7cb;
  criticalblock49.super_unique_lock._8_8_ = (long)"!res" + 4;
  blocktx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  blocktx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_0113a070;
  blocktx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_498._16_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_498._24_8_ = "";
  uVar10 = 0;
  uVar11 = 0;
  blocktx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&criticalblock49;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock48,(lazy_ostream *)&blocktx,1,0,WARN,_cVar12,
             (size_t)(local_498 + 0x10),599);
  boost::detail::shared_count::~shared_count(&sStack_3e0);
  pTVar4 = util::Result<wallet::CreatedTransactionResult>::value(&res);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)pTVar4);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult>
  ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult> *)
                      &res);
  pCVar2 = (this->wallet)._M_t.
           super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
           super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_498,
             &tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  local_348._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_348._M_impl.super__Rb_tree_header._M_header;
  local_348._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_348._M_impl._0_8_ = 0;
  local_348._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_348._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_348._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4b8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4b8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4b8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mapValue._M_t._M_impl._4_4_ = uVar11;
  mapValue._M_t._M_impl._0_4_ = uVar10;
  mapValue._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (undefined8)_cVar12;
  mapValue._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffffb08;
  mapValue._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffffb10;
  mapValue._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffffb18;
  mapValue._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffb20;
  orderForm.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffb30;
  orderForm.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb28;
  orderForm.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffb38;
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_348;
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_498;
  local_348._M_impl.super__Rb_tree_header._M_header._M_right =
       local_348._M_impl.super__Rb_tree_header._M_header._M_left;
  CWallet::CommitTransaction(pCVar2,tx_00,mapValue,orderForm);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_4b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_348);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_498 + 8));
  CMutableTransaction::CMutableTransaction(&blocktx);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock48,
             &((this->wallet)._M_t.
               super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
               super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
               super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->cs_wallet,
             "wallet->cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x25d,false);
  pmVar5 = std::__detail::
           _Map_base<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&((this->wallet)._M_t.
                     super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                     .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->mapWallet,
                &((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped);
  CMutableTransaction::CMutableTransaction
            ((CMutableTransaction *)&res,
             (pmVar5->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  CMutableTransaction::operator=(&blocktx,(CMutableTransaction *)&res);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&res);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock48.super_unique_lock);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)&criticalblock48,&blocktx);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&criticalblock48;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&criticalblock50,
             __l_00,(allocator_type *)&stack0xfffffffffffffb18);
  CKey::GetPubKey((CPubKey *)&res,&(this->super_TestChain100Setup).coinbaseKey);
  GetScriptForRawPubKey((CScript *)&criticalblock49,(CPubKey *)&res);
  TestChain100Setup::CreateAndProcessBlock
            (&local_3b8,&this->super_TestChain100Setup,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&criticalblock50,
             (CScript *)&criticalblock49,(Chainstate *)0x0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_3b8.vtx);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&criticalblock49);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&criticalblock50);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&criticalblock48);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock49,
             &((this->wallet)._M_t.
               super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
               super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
               super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->cs_wallet,
             "wallet->cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x262,false);
  val = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
         super_BasicTestingSetup.m_node.chainman;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x263,"AddTx","m_node.chainman");
  pvVar8 = (iterator)0x263;
  pvVar9 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock50,&cs_main,"Assert(m_node.chainman)->GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x263,false);
  pCVar2 = (this->wallet)._M_t.
           super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
           super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl;
  iVar3 = CWallet::GetLastBlockHeight(pCVar2);
  pCVar6 = ChainstateManager::ActiveChainstate
                     ((this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                      super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  CBlockIndex::GetBlockHash
            (&local_430,
             (pCVar6->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]);
  pCVar2->m_last_block_processed_height = iVar3 + 1;
  *(undefined8 *)(pCVar2->m_last_block_processed).super_base_blob<256U>.m_data._M_elems =
       local_430.super_base_blob<256U>.m_data._M_elems._0_8_;
  *(undefined8 *)((long)&(pCVar2->m_last_block_processed).super_base_blob<256U> + 8) =
       local_430.super_base_blob<256U>.m_data._M_elems._8_8_;
  *(undefined8 *)((long)&(pCVar2->m_last_block_processed).super_base_blob<256U> + 0x10) =
       local_430.super_base_blob<256U>.m_data._M_elems._16_8_;
  *(undefined8 *)((long)&(pCVar2->m_last_block_processed).super_base_blob<256U> + 0x18) =
       local_430.super_base_blob<256U>.m_data._M_elems._24_8_;
  iVar7 = std::
          _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(((this->wallet)._M_t.
                    super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                    .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->mapWallet)._M_h,
                 &((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped);
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  file_00.m_end = (iterator)0x266;
  file_00.m_begin = &stack0xfffffffffffffb38;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
             (size_t)&stack0xfffffffffffffb28,msg_00);
  criticalblock48.super_unique_lock._M_device._0_1_ =
       iVar7.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur !=
       (__node_type *)0x0;
  criticalblock48.super_unique_lock._M_owns = false;
  criticalblock48.super_unique_lock._9_7_ = 0;
  sStack_3e0.pi_ = (sp_counted_base *)0x0;
  res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._8_8_ =
       res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
       super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
       super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
       super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
       super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
       super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._8_8_ &
       0xffffffffffffff00;
  res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._0_8_ =
       &PTR__lazy_ostream_0113a070;
  res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._24_8_ =
       &stack0xfffffffffffffb18;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock48,(lazy_ostream *)&res,1,0,WARN,_cVar12,
             (size_t)&stack0xfffffffffffffb08,0x266);
  boost::detail::shared_count::~shared_count(&sStack_3e0);
  pCVar6 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  CBlockIndex::GetBlockHash
            ((uint256 *)&criticalblock48,
             (pCVar6->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]);
  pCVar6 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._32_4_ =
       (int)((ulong)((long)(pCVar6->m_chain).vChain.
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(pCVar6->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3) + -1;
  res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._0_8_ =
       CONCAT71(criticalblock48.super_unique_lock._M_device._1_7_,
                criticalblock48.super_unique_lock._M_device._0_1_);
  res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._16_8_ =
       sStack_3e0.pi_;
  res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._24_8_ =
       pCStack_3d8;
  res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._8_8_ =
       criticalblock48.super_unique_lock._8_8_;
  res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
  super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u._36_4_ = 1;
  std::
  variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
  ::operator=((variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
               *)((long)iVar7.
                        super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                        ._M_cur + 0x1d0),(TxStateConfirmed *)&res);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock50.super_unique_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock49.super_unique_lock);
  CMutableTransaction::~CMutableTransaction(&blocktx);
  CCoinControl::~CCoinControl(&dummy);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (CWalletTx *)
           ((long)iVar7.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                  ._M_cur + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

CWalletTx& AddTx(CRecipient recipient)
    {
        CTransactionRef tx;
        CCoinControl dummy;
        {
            auto res = CreateTransaction(*wallet, {recipient}, /*change_pos=*/std::nullopt, dummy);
            BOOST_CHECK(res);
            tx = res->tx;
        }
        wallet->CommitTransaction(tx, {}, {});
        CMutableTransaction blocktx;
        {
            LOCK(wallet->cs_wallet);
            blocktx = CMutableTransaction(*wallet->mapWallet.at(tx->GetHash()).tx);
        }
        CreateAndProcessBlock({CMutableTransaction(blocktx)}, GetScriptForRawPubKey(coinbaseKey.GetPubKey()));

        LOCK(wallet->cs_wallet);
        LOCK(Assert(m_node.chainman)->GetMutex());
        wallet->SetLastBlockProcessed(wallet->GetLastBlockHeight() + 1, m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        auto it = wallet->mapWallet.find(tx->GetHash());
        BOOST_CHECK(it != wallet->mapWallet.end());
        it->second.m_state = TxStateConfirmed{m_node.chainman->ActiveChain().Tip()->GetBlockHash(), m_node.chainman->ActiveChain().Height(), /*index=*/1};
        return it->second;
    }